

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlIDPtr xmlAddID(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlValidityErrorFunc p_Var2;
  xmlNodePtr pxVar3;
  long lVar4;
  xmlHashTablePtr local_40;
  xmlIDTablePtr table;
  xmlIDPtr ret;
  xmlAttrPtr attr_local;
  xmlChar *value_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (doc == (xmlDocPtr)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if ((value == (xmlChar *)0x0) || (*value == '\0')) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if (attr == (xmlAttrPtr)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    local_40 = (xmlHashTablePtr)doc->ids;
    if (local_40 == (xmlHashTablePtr)0x0) {
      local_40 = xmlHashCreateDict(0,doc->dict);
      doc->ids = local_40;
    }
    if (local_40 == (xmlHashTablePtr)0x0) {
      xmlVErrMemory(ctxt,"xmlAddID: Table creation failed!\n");
      ctxt_local = (xmlValidCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlValidCtxtPtr)(*xmlMalloc)(0x30);
      if (ctxt_local == (xmlValidCtxtPtr)0x0) {
        xmlVErrMemory(ctxt,"malloc failed");
        ctxt_local = (xmlValidCtxtPtr)0x0;
      }
      else {
        p_Var2 = (xmlValidityErrorFunc)xmlStrdup(value);
        ctxt_local->error = p_Var2;
        ctxt_local->nodeTab = (xmlNodePtr *)doc;
        iVar1 = xmlIsStreaming(ctxt);
        if (iVar1 == 0) {
          ctxt_local->warning = (xmlValidityWarningFunc)attr;
          ctxt_local->node = (xmlNodePtr)0x0;
        }
        else {
          if (doc->dict == (_xmlDict *)0x0) {
            pxVar3 = (xmlNodePtr)xmlStrdup(attr->name);
            ctxt_local->node = pxVar3;
          }
          else {
            pxVar3 = (xmlNodePtr)xmlDictLookup(doc->dict,attr->name,-1);
            ctxt_local->node = pxVar3;
          }
          ctxt_local->warning = (xmlValidityWarningFunc)0x0;
        }
        lVar4 = xmlGetLineNo(attr->parent);
        ctxt_local->nodeNr = (int)lVar4;
        iVar1 = xmlHashAddEntry(local_40,value,ctxt_local);
        if (iVar1 < 0) {
          if (ctxt != (xmlValidCtxtPtr)0x0) {
            xmlErrValidNode(ctxt,attr->parent,XML_DTD_ID_REDEFINED,"ID %s already defined\n",value,
                            (xmlChar *)0x0,(xmlChar *)0x0);
          }
          xmlFreeID((xmlIDPtr)ctxt_local);
          ctxt_local = (xmlValidCtxtPtr)0x0;
        }
        else if (attr != (xmlAttrPtr)0x0) {
          attr->atype = XML_ATTRIBUTE_ID;
        }
      }
    }
  }
  return (xmlIDPtr)ctxt_local;
}

Assistant:

xmlIDPtr
xmlAddID(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
         xmlAttrPtr attr) {
    xmlIDPtr ret;
    xmlIDTablePtr table;

    if (doc == NULL) {
	return(NULL);
    }
    if ((value == NULL) || (value[0] == 0)) {
	return(NULL);
    }
    if (attr == NULL) {
	return(NULL);
    }

    /*
     * Create the ID table if needed.
     */
    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)  {
        doc->ids = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
		"xmlAddID: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlIDPtr) xmlMalloc(sizeof(xmlID));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    ret->doc = doc;
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	if (doc->dict != NULL)
	    ret->name = xmlDictLookup(doc->dict, attr->name, -1);
	else
	    ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->attr = attr;
	ret->name = NULL;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    if (xmlHashAddEntry(table, value, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The id is already defined in this DTD.
	 */
	if (ctxt != NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_ID_REDEFINED,
			    "ID %s already defined\n", value, NULL, NULL);
	}
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeID(ret);
	return(NULL);
    }
    if (attr != NULL)
	attr->atype = XML_ATTRIBUTE_ID;
    return(ret);
}